

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O2

NextTask * __thiscall
dd::TaskQueueStdlib::GetNextTask(NextTask *__return_storage_ptr__,TaskQueueStdlib *this)

{
  unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *this_00;
  iterator __position;
  _Elt_pointer ppVar1;
  rep rVar2;
  long lVar3;
  size_type sVar4;
  
  __return_storage_ptr__->_final_task = false;
  this_00 = &__return_storage_ptr__->_run_task;
  (__return_storage_ptr__->_run_task)._M_t.
  super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
  super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
  super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = (QueuedTask *)0x0;
  __return_storage_ptr__->_sleep_time_ms = 0;
  rVar2 = GetCurrentTick();
  pthread_mutex_lock((pthread_mutex_t *)&this->_pending_lock);
  if (this->_thread_should_quit == true) {
    __return_storage_ptr__->_final_task = true;
    goto LAB_0012aa14;
  }
  if ((this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_0012a98c:
    sVar4 = std::
            deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
            ::size(&(this->_pending_queue).c);
    if (sVar4 == 0) goto LAB_0012aa14;
    std::__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>::operator=
              ((__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *)this_00,
               (__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *)
               &((this->_pending_queue).c.
                 super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur)->second);
  }
  else {
    __position._M_node = (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    lVar3 = *(long *)(__position._M_node + 1) - rVar2;
    if (lVar3 != 0 && rVar2 <= *(long *)(__position._M_node + 1)) {
      __return_storage_ptr__->_sleep_time_ms = lVar3;
      goto LAB_0012a98c;
    }
    sVar4 = std::
            deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
            ::size(&(this->_pending_queue).c);
    if ((sVar4 == 0) ||
       (ppVar1 = (this->_pending_queue).c.
                 super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur,
       __position._M_node[1]._M_parent <= (_Base_ptr)ppVar1->first)) {
      std::__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>::operator=
                ((__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *)this_00,
                 (__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *)
                 &__position._M_node[1]._M_left);
      std::
      _Rb_tree<dd::TaskQueueStdlib::DelayedEntryTimeout,std::pair<dd::TaskQueueStdlib::DelayedEntryTimeout_const,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::_Select1st<std::pair<dd::TaskQueueStdlib::DelayedEntryTimeout_const,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>,std::less<dd::TaskQueueStdlib::DelayedEntryTimeout>,std::allocator<std::pair<dd::TaskQueueStdlib::DelayedEntryTimeout_const,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>
      ::erase_abi_cxx11_((_Rb_tree<dd::TaskQueueStdlib::DelayedEntryTimeout,std::pair<dd::TaskQueueStdlib::DelayedEntryTimeout_const,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::_Select1st<std::pair<dd::TaskQueueStdlib::DelayedEntryTimeout_const,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>,std::less<dd::TaskQueueStdlib::DelayedEntryTimeout>,std::allocator<std::pair<dd::TaskQueueStdlib::DelayedEntryTimeout_const,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>
                          *)&this->_delayed_queue,__position);
      goto LAB_0012aa14;
    }
    std::__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>::operator=
              ((__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *)this_00,
               (__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *)
               &ppVar1->second);
  }
  std::
  deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ::pop_front(&(this->_pending_queue).c);
LAB_0012aa14:
  pthread_mutex_unlock((pthread_mutex_t *)&this->_pending_lock);
  return __return_storage_ptr__;
}

Assistant:

dd::TaskQueueStdlib::NextTask TaskQueueStdlib::GetNextTask()
	{
		NextTask result{};
		auto tick = GetCurrentTick();
		AutoLock lock(_pending_lock);
		if (_thread_should_quit) {
			result._final_task = true;
			return result;
		}

		if (_delayed_queue.size() > 0) {
			auto delayed_entry = _delayed_queue.begin();
			const auto& delay_info = delayed_entry->first;
			auto& delay_run = delayed_entry->second;
			if (tick >= delay_info._next_fire_at_ms) {
				if (_pending_queue.size() > 0) {
					auto& entry = _pending_queue.front();
					auto& entry_order = entry.first;
					auto& entry_run = entry.second;
					if (entry_order < delay_info._order){
						result._run_task = std::move(entry_run);
						_pending_queue.pop();
						return result;
					}
				}

				result._run_task = std::move(delay_run);
				_delayed_queue.erase(delayed_entry);
				return result;
			}
			result._sleep_time_ms = delay_info._next_fire_at_ms - tick;
		}

		if (_pending_queue.size() > 0) {
			auto& entry = _pending_queue.front();
			result._run_task = std::move(entry.second);
			_pending_queue.pop();
		}
		return result;
	}